

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O0

void __thiscall leveldb::Benchmark::HeapProfile(Benchmark *this)

{
  char *pcVar1;
  long *plVar2;
  FILE *__stream;
  bool bVar3;
  undefined8 uVar4;
  allocator local_101;
  string local_100 [32];
  Status local_e0;
  byte local_d5;
  undefined4 local_d4;
  bool ok;
  allocator local_a9;
  string local_a8 [32];
  Status local_88;
  Status s;
  WritableFile *file;
  char fname [100];
  Benchmark *this_local;
  
  pcVar1 = FLAGS_db;
  this->heap_counter_ = this->heap_counter_ + 1;
  unique0x1000027f = this;
  snprintf((char *)&file,100,"%s/heap-%04d",pcVar1);
  plVar2 = (anonymous_namespace)::g_env;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,(char *)&file,&local_a9);
  (**(code **)(*plVar2 + 0x20))(&local_88,plVar2,local_a8,&s);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  bVar3 = Status::ok(&local_88);
  __stream = _stderr;
  if (bVar3) {
    local_d5 = port::GetHeapProfile(WriteToFile,s.state_);
    if (s.state_ != (char *)0x0) {
      (**(code **)(*(long *)s.state_ + 8))();
    }
    if ((local_d5 & 1) == 0) {
      fprintf(_stderr,"heap profiling not supported\n");
      plVar2 = (anonymous_namespace)::g_env;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,(char *)&file,&local_101);
      (**(code **)(*plVar2 + 0x40))(&local_e0,plVar2,local_100);
      Status::~Status(&local_e0);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
    }
    local_d4 = 0;
  }
  else {
    Status::ToString_abi_cxx11_((Status *)&stack0xffffffffffffff30);
    uVar4 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s\n",uVar4);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
    local_d4 = 1;
  }
  Status::~Status(&local_88);
  return;
}

Assistant:

void HeapProfile() {
    char fname[100];
    std::snprintf(fname, sizeof(fname), "%s/heap-%04d", FLAGS_db,
                  ++heap_counter_);
    WritableFile* file;
    Status s = g_env->NewWritableFile(fname, &file);
    if (!s.ok()) {
      std::fprintf(stderr, "%s\n", s.ToString().c_str());
      return;
    }
    bool ok = port::GetHeapProfile(WriteToFile, file);
    delete file;
    if (!ok) {
      std::fprintf(stderr, "heap profiling not supported\n");
      g_env->RemoveFile(fname);
    }
  }